

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_argmax(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  undefined4 uVar13;
  undefined1 auVar14 [16];
  
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F32) {
    if ((params->ith == 0) && (lVar3 = pgVar2->ne[1], 0 < lVar3)) {
      sVar4 = pgVar2->nb[1];
      sVar5 = dst->nb[0];
      pvVar11 = pgVar2->data;
      pvVar6 = dst->data;
      lVar12 = 0;
      uVar10 = (uint)pgVar2->ne[0];
      do {
        uVar13 = 0;
        if (0 < (int)uVar10) {
          uVar7 = 0;
          uVar13 = 0;
          auVar14 = SUB6416(ZEXT464(0xff800000),0);
          do {
            fVar1 = *(float *)((long)pvVar11 + uVar7 * 4);
            auVar14 = vmaxss_avx(auVar14,ZEXT416((uint)fVar1));
            uVar9 = (int)uVar7;
            if (auVar14._0_4_ != fVar1) {
              uVar9 = uVar13;
            }
            if (!NAN(auVar14._0_4_) && !NAN(fVar1)) {
              uVar13 = uVar9;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar7);
        }
        lVar8 = lVar12 * sVar5;
        lVar12 = lVar12 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar4);
        *(undefined4 *)((long)pvVar6 + lVar8) = uVar13;
      } while (lVar12 != lVar3);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x848,"fatal error");
}

Assistant:

void ggml_compute_forward_argmax(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argmax_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}